

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

void __thiscall
wasm::ParallelFuncCastEmulation::visitCallIndirect
          (ParallelFuncCastEmulation *this,CallIndirect *curr)

{
  ExpressionList *this_00;
  ulong uVar1;
  Type type;
  Expression **ppEVar2;
  Expression *pEVar3;
  ExpressionList *__range2;
  undefined1 local_1c0 [392];
  size_t local_38;
  
  uVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (this->numParams < uVar1) {
    Fatal::Fatal((Fatal *)local_1c0);
    std::operator<<((ostream *)(local_1c0 + 0x10),"max-func-params needs to be at least ");
    local_38 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    Fatal::operator<<((Fatal *)local_1c0,&local_38);
    Fatal::~Fatal((Fatal *)local_1c0);
  }
  this_00 = &curr->operands;
  local_1c0._8_8_ = 0;
  local_1c0._0_8_ = this_00;
  while ((local_1c0._8_8_ != uVar1 || ((ExpressionList *)local_1c0._0_8_ != this_00))) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_1c0);
    pEVar3 = toABI(*ppEVar2,(this->
                            super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                            ).
                            super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                            .
                            super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                            .currModule);
    *ppEVar2 = pEVar3;
    local_1c0._8_8_ = local_1c0._8_8_ + 1;
  }
  while ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
         .usedElements < (ulong)this->numParams) {
    pEVar3 = LiteralUtils::makeZero
                       ((Type)0x3,
                        (this->
                        super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                        ).
                        super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                        .
                        super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                        .currModule);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar3);
  }
  (curr->heapType).id = (this->ABIType).id;
  type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id;
  (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 3;
  CallIndirect::finalize(curr);
  pEVar3 = fromABI((Expression *)curr,type,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                   ).
                   super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .
                   super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .currModule);
  Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>::
  replaceCurrent(&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                  ).
                  super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                  .
                  super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                 ,pEVar3);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->operands.size() > numParams) {
      Fatal() << "max-func-params needs to be at least "
              << curr->operands.size();
    }
    for (Expression*& operand : curr->operands) {
      operand = toABI(operand, getModule());
    }
    // Add extra operands as needed.
    while (curr->operands.size() < numParams) {
      curr->operands.push_back(LiteralUtils::makeZero(Type::i64, *getModule()));
    }
    // Set the new types
    curr->heapType = ABIType;
    auto oldType = curr->type;
    curr->type = Type::i64;
    curr->finalize(); // may be unreachable
    // Fix up return value
    replaceCurrent(fromABI(curr, oldType, getModule()));
  }